

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribInitialCase::test
          (CurrentVertexAttribInitialCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  TestContext *this_02;
  GLuint index;
  int attribute_count;
  StateQueryMemoryWriteGuard<float[4]> attribValue;
  GLint local_1ec;
  StateQueryMemoryWriteGuard<float[4]> local_1e8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1ec = 0x10;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&local_1ec);
  if (0 < local_1ec) {
    this_01 = (ostringstream *)(local_1b0 + 8);
    index = 0;
    do {
      local_1e8.m_postguard[0] = -8.0297587e+18;
      local_1e8.m_postguard[1] = -8.0297587e+18;
      local_1e8.m_postguard[2] = -8.0297587e+18;
      local_1e8.m_postguard[3] = -8.0297587e+18;
      local_1e8.m_value[0] = -8.0297587e+18;
      local_1e8.m_value[1] = -8.0297587e+18;
      local_1e8.m_value[2] = -8.0297587e+18;
      local_1e8.m_value[3] = -8.0297587e+18;
      local_1e8.m_preguard[0] = -8.0297587e+18;
      local_1e8.m_preguard[1] = -8.0297587e+18;
      local_1e8.m_preguard[2] = -8.0297587e+18;
      local_1e8.m_preguard[3] = -8.0297587e+18;
      glu::CallLogWrapper::glGetVertexAttribfv(this_00,index,0x8626,local_1e8.m_value);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                (&local_1e8,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      if (((((local_1e8.m_value[0] != 0.0) || (NAN(local_1e8.m_value[0]))) ||
           (local_1e8.m_value[1] != 0.0)) ||
          ((NAN(local_1e8.m_value[1]) || (local_1e8.m_value[2] != 0.0)))) ||
         ((NAN(local_1e8.m_value[2]) ||
          ((local_1e8.m_value[3] != 1.0 || (NAN(local_1e8.m_value[3]))))))) {
        local_1b0._0_8_ =
             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"// ERROR: Expected [0, 0, 0, 1];",0x20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"got [",5);
        std::ostream::_M_insert<double>((double)local_1e8.m_value[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,",",1);
        std::ostream::_M_insert<double>((double)local_1e8.m_value[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,",",1);
        std::ostream::_M_insert<double>((double)local_1e8.m_value[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,",",1);
        std::ostream::_M_insert<double>((double)local_1e8.m_value[3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base(local_138);
        this_02 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid attribute value")
          ;
        }
      }
      index = index + 1;
    } while ((int)index < local_1ec);
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// initial

		for (int index = 0; index < attribute_count; ++index)
		{
			StateQueryMemoryWriteGuard<GLfloat[4]> attribValue;
			glGetVertexAttribfv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);
			attribValue.verifyValidity(m_testCtx);

			if (attribValue[0] != 0.0f || attribValue[1] != 0.0f || attribValue[2] != 0.0f || attribValue[3] != 1.0f)
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected [0, 0, 0, 1];"
					<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
					<< TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
			}
		}
	}